

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O2

void secp256k1_dleq_challenge
               (secp256k1_scalar *e,secp256k1_ge *gen2,secp256k1_ge *r1,secp256k1_ge *r2,
               secp256k1_ge *p1,secp256k1_ge *p2)

{
  uchar buf [32];
  secp256k1_sha256 sha;
  uchar local_b8 [32];
  secp256k1_sha256 local_98;
  
  secp256k1_nonce_function_dleq_sha256_tagged(&local_98);
  secp256k1_dleq_hash_point(&local_98,p1);
  secp256k1_dleq_hash_point(&local_98,gen2);
  secp256k1_dleq_hash_point(&local_98,p2);
  secp256k1_dleq_hash_point(&local_98,r1);
  secp256k1_dleq_hash_point(&local_98,r2);
  secp256k1_sha256_finalize(&local_98,local_b8);
  secp256k1_scalar_set_b32(e,local_b8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge(secp256k1_scalar *e, secp256k1_ge *gen2, secp256k1_ge *r1, secp256k1_ge *r2, secp256k1_ge *p1, secp256k1_ge *p2) {
    unsigned char buf[32];
    secp256k1_sha256 sha;

    secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(e, buf, NULL);
}